

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O1

void __thiscall YAML::SingleDocParser::HandleNode(SingleDocParser *this,EventHandler *eventHandler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CollectionStack *pCVar2;
  bool bVar3;
  int iVar4;
  Token *pTVar5;
  anchor_t aVar6;
  _Elt_pointer pvVar7;
  char *pcVar8;
  undefined8 uVar9;
  long lVar10;
  Mark MVar11;
  Mark mark;
  anchor_t anchor;
  string tag;
  DepthGuard<500> depthguard;
  string anchor_name;
  Mark local_a8;
  anchor_t local_98;
  string local_90;
  DepthGuard<500> local_70;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  MVar11 = Scanner::mark(this->m_scanner);
  local_68._M_dataplus._M_p = MVar11._0_8_;
  local_68._M_string_length._0_4_ = MVar11.column;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bad file","");
  DepthGuard<500>::DepthGuard(&local_70,&this->depth,(Mark *)&local_68,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  bVar3 = Scanner::empty(this->m_scanner);
  if (bVar3) {
    MVar11 = Scanner::mark(this->m_scanner);
    local_90._M_dataplus._M_p = MVar11._0_8_;
    local_90._M_string_length._0_4_ = MVar11.column;
    (*eventHandler->_vptr_EventHandler[4])(eventHandler,&local_90,0);
    goto LAB_007276b7;
  }
  pTVar5 = Scanner::peek(this->m_scanner);
  local_a8.column = (pTVar5->mark).column;
  local_a8.pos = (pTVar5->mark).pos;
  local_a8.line = (pTVar5->mark).line;
  pTVar5 = Scanner::peek(this->m_scanner);
  if (pTVar5->type == VALUE) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"?","");
    (*eventHandler->_vptr_EventHandler[9])(eventHandler,&local_a8,&local_90,0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    HandleMap(this,eventHandler);
    (*eventHandler->_vptr_EventHandler[10])(eventHandler);
    goto LAB_007276b7;
  }
  pTVar5 = Scanner::peek(this->m_scanner);
  if (pTVar5->type == ALIAS) {
    pTVar5 = Scanner::peek(this->m_scanner);
    aVar6 = LookupAnchor(this,&local_a8,&pTVar5->value);
    (*eventHandler->_vptr_EventHandler[5])(eventHandler,&local_a8,aVar6);
    Scanner::pop(this->m_scanner);
    goto LAB_007276b7;
  }
  local_90._M_string_length._0_4_ = 0;
  local_90._M_string_length._4_4_ = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_68._M_string_length._0_4_ = 0;
  local_68._M_string_length._4_4_ = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar1;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ParseProperties(this,&local_90,&local_98,&local_68);
  if (CONCAT44(local_68._M_string_length._4_4_,(int)local_68._M_string_length) != 0) {
    (*eventHandler->_vptr_EventHandler[0xb])(eventHandler,&local_a8,&local_68);
  }
  bVar3 = Scanner::empty(this->m_scanner);
  if (bVar3) {
    (*eventHandler->_vptr_EventHandler[4])(eventHandler,&local_a8,local_98);
    goto LAB_00727699;
  }
  pTVar5 = Scanner::peek(this->m_scanner);
  if (CONCAT44(local_90._M_string_length._4_4_,(int)local_90._M_string_length) == 0) {
    pcVar8 = "?";
    if (pTVar5->type == NON_PLAIN_SCALAR) {
      pcVar8 = "!";
    }
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar8);
  }
  if (((pTVar5->type == PLAIN_SCALAR) &&
      (iVar4 = std::__cxx11::string::compare((char *)&local_90), iVar4 == 0)) &&
     (bVar3 = IsNullString(&pTVar5->value), bVar3)) {
    (*eventHandler->_vptr_EventHandler[4])(eventHandler,&local_a8,local_98);
LAB_0072762a:
    Scanner::pop(this->m_scanner);
    goto LAB_00727699;
  }
  uVar9 = 2;
  switch(pTVar5->type) {
  case BLOCK_SEQ_START:
    uVar9 = 1;
  case FLOW_SEQ_START:
    (*eventHandler->_vptr_EventHandler[7])(eventHandler,&local_a8,&local_90,local_98,uVar9);
    lVar10 = 0x40;
    HandleSequence(this,eventHandler);
LAB_0072768f:
    (**(code **)((long)eventHandler->_vptr_EventHandler + lVar10))(eventHandler);
    goto LAB_00727699;
  case BLOCK_MAP_START:
    uVar9 = 1;
  case FLOW_MAP_START:
switchD_007275cd_caseD_9:
    (*eventHandler->_vptr_EventHandler[9])(eventHandler,&local_a8,&local_90,local_98,uVar9);
    lVar10 = 0x50;
    HandleMap(this,eventHandler);
    goto LAB_0072768f;
  case BLOCK_SEQ_END:
  case BLOCK_MAP_END:
  case BLOCK_ENTRY:
  case FLOW_SEQ_END:
  case FLOW_MAP_END:
  case FLOW_MAP_COMPACT:
  case FLOW_ENTRY:
    break;
  case KEY:
    pCVar2 = (this->m_pCollectionStack)._M_t.
             super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
             .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl;
    pvVar7 = (pCVar2->collectionStack).c.
             super__Deque_base<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar7 != (pCVar2->collectionStack).c.
                  super__Deque_base<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pvVar7 == (pCVar2->collectionStack).c.
                    super__Deque_base<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar7 = (pCVar2->collectionStack).c.
                 super__Deque_base<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      if (pvVar7[-1] == FlowSeq) goto switchD_007275cd_caseD_9;
    }
    break;
  default:
    if (pTVar5->type - PLAIN_SCALAR < 2) {
      (*eventHandler->_vptr_EventHandler[6])
                (eventHandler,&local_a8,&local_90,local_98,&pTVar5->value);
      goto LAB_0072762a;
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar4 == 0) {
    (*eventHandler->_vptr_EventHandler[4])(eventHandler,&local_a8,local_98);
  }
  else {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
    (*eventHandler->_vptr_EventHandler[6])(eventHandler,&local_a8,&local_90,local_98,local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
LAB_00727699:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
LAB_007276b7:
  *local_70.m_depth = *local_70.m_depth + -1;
  return;
}

Assistant:

void SingleDocParser::HandleNode(EventHandler& eventHandler) {
  DepthGuard<500> depthguard(depth, m_scanner.mark(), ErrorMsg::BAD_FILE);

  // an empty node *is* a possibility
  if (m_scanner.empty()) {
    eventHandler.OnNull(m_scanner.mark(), NullAnchor);
    return;
  }

  // save location
  Mark mark = m_scanner.peek().mark;

  // special case: a value node by itself must be a map, with no header
  if (m_scanner.peek().type == Token::VALUE) {
    eventHandler.OnMapStart(mark, "?", NullAnchor, EmitterStyle::Default);
    HandleMap(eventHandler);
    eventHandler.OnMapEnd();
    return;
  }

  // special case: an alias node
  if (m_scanner.peek().type == Token::ALIAS) {
    eventHandler.OnAlias(mark, LookupAnchor(mark, m_scanner.peek().value));
    m_scanner.pop();
    return;
  }

  std::string tag;
  std::string anchor_name;
  anchor_t anchor;
  ParseProperties(tag, anchor, anchor_name);

  if (!anchor_name.empty())
    eventHandler.OnAnchor(mark, anchor_name);

  // after parsing properties, an empty node is again a possibility
  if (m_scanner.empty()) {
    eventHandler.OnNull(mark, anchor);
    return;
  }

  const Token& token = m_scanner.peek();

  // add non-specific tags
  if (tag.empty())
    tag = (token.type == Token::NON_PLAIN_SCALAR ? "!" : "?");
  
  if (token.type == Token::PLAIN_SCALAR 
      && tag.compare("?") == 0 && IsNullString(token.value)) {
    eventHandler.OnNull(mark, anchor);
    m_scanner.pop();
    return;
  }

  // now split based on what kind of node we should be
  switch (token.type) {
    case Token::PLAIN_SCALAR:
    case Token::NON_PLAIN_SCALAR:
      eventHandler.OnScalar(mark, tag, anchor, token.value);
      m_scanner.pop();
      return;
    case Token::FLOW_SEQ_START:
      eventHandler.OnSequenceStart(mark, tag, anchor, EmitterStyle::Flow);
      HandleSequence(eventHandler);
      eventHandler.OnSequenceEnd();
      return;
    case Token::BLOCK_SEQ_START:
      eventHandler.OnSequenceStart(mark, tag, anchor, EmitterStyle::Block);
      HandleSequence(eventHandler);
      eventHandler.OnSequenceEnd();
      return;
    case Token::FLOW_MAP_START:
      eventHandler.OnMapStart(mark, tag, anchor, EmitterStyle::Flow);
      HandleMap(eventHandler);
      eventHandler.OnMapEnd();
      return;
    case Token::BLOCK_MAP_START:
      eventHandler.OnMapStart(mark, tag, anchor, EmitterStyle::Block);
      HandleMap(eventHandler);
      eventHandler.OnMapEnd();
      return;
    case Token::KEY:
      // compact maps can only go in a flow sequence
      if (m_pCollectionStack->GetCurCollectionType() ==
          CollectionType::FlowSeq) {
        eventHandler.OnMapStart(mark, tag, anchor, EmitterStyle::Flow);
        HandleMap(eventHandler);
        eventHandler.OnMapEnd();
        return;
      }
      break;
    default:
      break;
  }

  if (tag == "?")
    eventHandler.OnNull(mark, anchor);
  else
    eventHandler.OnScalar(mark, tag, anchor, "");
}